

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.cc
# Opt level: O0

int __thiscall tchecker::parsing::system::parser_t::parse(parser_t *this)

{
  char cVar1;
  bool bVar2;
  symbol_kind_type sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  stack_symbol_type *psVar8;
  int *__args_4;
  attributes_t *paVar9;
  attributes_t *paVar10;
  runtime_error *this_00;
  attr_parsing_position_t *__args_2;
  shared_ptr<tchecker::parsing::attr_t> *psVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
  *pvVar13;
  vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
  *this_01;
  element_type *peVar14;
  basic_ostream<char,_std::char_traits<char>_> *pbVar15;
  shared_ptr<tchecker::parsing::sync_constraint_t> *psVar16;
  sync_strength_t *psVar17;
  longlong lVar18;
  int *piVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  unsigned_long uVar21;
  out_of_range *poVar22;
  uint *puVar23;
  index_type iVar24;
  basic_symbol<tchecker::parsing::system::parser_t::by_state> *pbVar25;
  counter_type *local_21a0;
  stack_symbol_type *local_1750;
  undefined1 local_1748 [8];
  stack_symbol_type error_token;
  string local_16c0 [8];
  string msg;
  context yyctx;
  syntax_error *yyexc_1;
  exception *e_8;
  unsigned_long l_1;
  exception *e_7;
  longlong l;
  undefined1 local_1658 [8];
  shared_ptr<const_tchecker::parsing::event_declaration_t> event_1;
  shared_ptr<const_tchecker::parsing::process_declaration_t> proc_2;
  string local_1618;
  attr_parsing_position_t local_15f8;
  undefined1 local_15b8 [24];
  stringstream local_15a0 [8];
  stringstream value_loc;
  basic_ostream<char,_std::char_traits<char>_> local_1590 [376];
  stringstream local_1418 [8];
  stringstream key_loc;
  basic_ostream<char,_std::char_traits<char>_> local_1408 [384];
  exception *e_6;
  string local_1278 [32];
  undefined1 local_1258 [8];
  shared_ptr<tchecker::parsing::sync_declaration_t> d_6;
  stringstream loc_7;
  basic_ostream<char,_std::char_traits<char>_> local_1238 [384];
  exception *e_5;
  string local_10a8 [32];
  undefined1 local_1088 [8];
  shared_ptr<tchecker::parsing::process_declaration_t> d_5;
  stringstream loc_6;
  basic_ostream<char,_std::char_traits<char>_> local_1068 [376];
  undefined1 local_ef0 [8];
  shared_ptr<const_tchecker::parsing::process_declaration_t> exist_d_4;
  exception *e_4;
  string local_ec8 [32];
  undefined1 local_ea8 [8];
  shared_ptr<tchecker::parsing::location_declaration_t> d_4;
  stringstream loc_5;
  basic_ostream<char,_std::char_traits<char>_> local_e88 [376];
  undefined1 local_d10 [8];
  shared_ptr<const_tchecker::parsing::process_declaration_t> proc_1;
  shared_ptr<const_tchecker::parsing::location_declaration_t> exist_d_3;
  exception *e_3;
  string local_cd8 [32];
  undefined1 local_cb8 [8];
  shared_ptr<tchecker::parsing::int_declaration_t> d_3;
  stringstream loc_4;
  basic_ostream<char,_std::char_traits<char>_> local_c98 [376];
  undefined1 local_b20 [8];
  shared_ptr<const_tchecker::parsing::clock_declaration_t> clockd;
  shared_ptr<const_tchecker::parsing::int_declaration_t> exist_d_2;
  exception *e_2;
  string local_ae8 [32];
  undefined1 local_ac8 [8];
  shared_ptr<tchecker::parsing::event_declaration_t> d_2;
  stringstream loc_3;
  basic_ostream<char,_std::char_traits<char>_> local_aa8 [376];
  undefined1 local_930 [8];
  shared_ptr<const_tchecker::parsing::event_declaration_t> exist_d_1;
  exception *e_1;
  string local_908 [32];
  undefined1 local_8e8 [8];
  shared_ptr<tchecker::parsing::edge_declaration_t> d_1;
  stringstream loc_2;
  basic_ostream<char,_std::char_traits<char>_> local_8c8 [376];
  undefined1 local_750 [8];
  shared_ptr<const_tchecker::parsing::event_declaration_t> event;
  shared_ptr<const_tchecker::parsing::location_declaration_t> tgt;
  shared_ptr<const_tchecker::parsing::location_declaration_t> src;
  shared_ptr<const_tchecker::parsing::process_declaration_t> proc;
  exception *e;
  undefined1 local_6e8 [8];
  shared_ptr<tchecker::parsing::clock_declaration_t> d;
  stringstream loc_1;
  basic_ostream<char,_std::char_traits<char>_> local_6c8 [376];
  undefined1 local_550 [8];
  shared_ptr<const_tchecker::parsing::int_declaration_t> intd;
  shared_ptr<const_tchecker::parsing::clock_declaration_t> exist_d;
  shared_ptr<tchecker::parsing::system_declaration_t> local_520;
  string local_510 [32];
  undefined1 local_4f0 [24];
  stringstream loc;
  basic_ostream<char,_std::char_traits<char>_> local_4d0 [376];
  undefined1 local_358 [8];
  slice range;
  stack_symbol_type yylhs;
  syntax_error *yyexc;
  symbol_type yylookahead;
  int yyresult;
  undefined1 local_228 [8];
  stack_symbol_type yyerror_range [3];
  symbol_type yyla;
  int yyerrstatus_;
  int yynerrs_;
  int yylen;
  int yyn;
  parser_t *this_local;
  
  yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.column = 0;
  yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.line = 0;
  symbol_type::symbol_type
            ((symbol_type *)
             &yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
              location.end.line);
  local_1750 = (stack_symbol_type *)local_228;
  do {
    stack_symbol_type::stack_symbol_type(local_1750);
    local_1750 = local_1750 + 1;
  } while (local_1750 !=
           (stack_symbol_type *)
           &yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
            location.end.line);
  if (this->yydebug_ != 0) {
    std::operator<<(this->yycdebug_,"Starting parse\n");
  }
  yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.value._72_8_ =
       this->filename;
  yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.begin._8_8_ =
       yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.value._72_8_;
  old_error_count = log_error_count();
  stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
  ::clear(&this->yystack_);
  yypush_(this,(char *)0x0,'\0',
          (symbol_type *)
          &yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
           location.end.line);
  while( true ) {
    if (this->yydebug_ != 0) {
      poVar7 = std::operator<<(this->yycdebug_,"Entering state ");
      psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
               ::operator[](&this->yystack_,0);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,(int)(psVar8->
                                      super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                      ).super_by_state.state);
      std::operator<<(poVar7,'\n');
    }
    if (this->yydebug_ != 0) {
      (*this->_vptr_parser_t[6])();
    }
    psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
             ::operator[](&this->yystack_,0);
    if ((psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).super_by_state.
        state == '\x05') break;
    psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
             ::operator[](&this->yystack_,0);
    cVar1 = yypact_[(int)(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                         .super_by_state.state];
    bVar2 = yy_pact_value_is_default_((int)cVar1);
    if (bVar2) {
LAB_002dd6f4:
      psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
               ::operator[](&this->yystack_,0);
      yynerrs_ = (int)(char)yydefact_[(int)(psVar8->
                                           super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                           ).super_by_state.state];
      if (yynerrs_ == 0) {
LAB_002e19ba:
        if (yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.line
            == 0) {
          yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.column
               = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.
                 column + 1;
          context::context((context *)((long)&msg.field_2 + 8),this,
                           (symbol_type *)
                           &yyerror_range[2].
                            super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                            location.end.line);
          (*this->_vptr_parser_t[4])(local_16c0,this,(undefined1 *)((long)&msg.field_2 + 8));
          (*this->_vptr_parser_t[3])
                    (this,&yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.
                           value.field_0x48,local_16c0);
          std::__cxx11::string::~string(local_16c0);
        }
        yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.value.
        _72_8_ = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.value._72_8_;
        yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
        begin.filename =
             yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.begin.
             filename;
        yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
        begin.line = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.
                     begin.line;
        yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
        begin.column = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.
                       location.begin.column;
        yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
        end.filename = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.
                       location.end.filename;
        if (yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.line
            == 3) {
          sVar3 = by_kind::kind((by_kind *)
                                &yyerror_range[2].
                                 super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                                 location.end.line);
          if (sVar3 == S_YYEOF) {
LAB_002e1d88:
            yylookahead.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.
            end.line = 1;
            goto LAB_002e1d92;
          }
          bVar2 = basic_symbol<tchecker::parsing::system::parser_t::by_kind>::empty
                            ((basic_symbol<tchecker::parsing::system::parser_t::by_kind> *)
                             &yyerror_range[2].
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                              location.end.line);
          if (!bVar2) {
            yy_destroy_<tchecker::parsing::system::parser_t::by_kind>
                      (this,"Error: discarding",
                       (basic_symbol<tchecker::parsing::system::parser_t::by_kind> *)
                       &yyerror_range[2].
                        super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
                        end.line);
            basic_symbol<tchecker::parsing::system::parser_t::by_kind>::clear
                      ((basic_symbol<tchecker::parsing::system::parser_t::by_kind> *)
                       &yyerror_range[2].
                        super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
                        end.line);
          }
        }
        goto LAB_002e1b19;
      }
LAB_002dd739:
      iVar6 = (int)(char)yyr2_[yynerrs_];
      stack_symbol_type::stack_symbol_type((stack_symbol_type *)&range.range_);
      psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
               ::operator[](&this->yystack_,(long)iVar6);
      range.range_._0_1_ =
           yy_lr_goto_state_((psVar8->
                             super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                             super_by_state.state,(int)(char)yyr1_[yynerrs_]);
      switch(yyr1_[yynerrs_]) {
      case 0xc:
      case 0xe:
      case 0x13:
      case 0x1d:
        value_type::emplace<std::__cxx11::string>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                    field_0x8);
        break;
      default:
        break;
      case 0x1a:
      case 0x1b:
        value_type::emplace<tchecker::parsing::attributes_t>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                    field_0x8);
        break;
      case 0x1c:
        value_type::emplace<std::shared_ptr<tchecker::parsing::attr_t>>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                    field_0x8);
        break;
      case 0x1e:
        value_type::
        emplace<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                    field_0x8);
        break;
      case 0x1f:
        value_type::emplace<std::shared_ptr<tchecker::parsing::sync_constraint_t>>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                    field_0x8);
        break;
      case 0x20:
        value_type::emplace<tchecker::sync_strength_t>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                    field_0x8);
        break;
      case 0x23:
        value_type::emplace<int>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                    field_0x8);
        break;
      case 0x24:
        value_type::emplace<unsigned_int>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                    field_0x8);
      }
      stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
      ::slice::slice((slice *)local_358,&this->yystack_,(long)iVar6);
      if (iVar6 == 0) {
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::slice::operator[]((slice *)local_358,0);
        yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.value._72_8_ =
             (psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.
             end.filename;
        yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.begin.
        filename = *(filename_type **)
                    &(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                     location.end.line;
        yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.begin._8_8_
             = yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.value._72_8_;
        yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.end.
        filename = yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
                   begin.filename;
      }
      else {
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::slice::operator[]((slice *)local_358,1);
        yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.value._72_8_ =
             (psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.
             begin.filename;
        yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.begin.
        filename = *(filename_type **)
                    &(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                     location.begin.line;
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::slice::operator[]((slice *)local_358,(long)iVar6);
        yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.begin._8_8_
             = (psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.
               end.filename;
        yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.end.
        filename = *(filename_type **)
                    &(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                     location.end.line;
      }
      yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.value.
      _72_8_ = yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.value._72_8_;
      yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
      begin.filename =
           yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.begin.
           filename;
      yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
      begin.line = yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
                   begin.line;
      yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
      begin.column = yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                     location.begin.column;
      yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
      end.filename = yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                     location.end.filename;
      if (this->yydebug_ != 0) {
        (*this->_vptr_parser_t[5])(this,(ulong)(uint)yynerrs_);
      }
      switch(yynerrs_) {
      case 2:
        std::__cxx11::stringstream::stringstream((stringstream *)(local_4f0 + 0x10));
        system::operator<<(local_4d0,
                           (location *)
                           &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                            value.field_0x48);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        pbVar20 = value_type::as<std::__cxx11::string>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  value_type::as<tchecker::parsing::attributes_t>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        std::__cxx11::stringstream::str();
        std::
        make_shared<tchecker::parsing::system_declaration_t,std::__cxx11::string&,tchecker::parsing::attributes_t&,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0,
                   (attributes_t *)pbVar20,pbVar12);
        std::shared_ptr<tchecker::parsing::system_declaration_t>::operator=
                  (this->system_declaration,
                   (shared_ptr<tchecker::parsing::system_declaration_t> *)local_4f0);
        std::shared_ptr<tchecker::parsing::system_declaration_t>::~shared_ptr
                  ((shared_ptr<tchecker::parsing::system_declaration_t> *)local_4f0);
        std::__cxx11::string::~string(local_510);
        std::__cxx11::stringstream::~stringstream((stringstream *)(local_4f0 + 0x10));
        break;
      case 3:
        uVar5 = log_error_count();
        if (old_error_count < uVar5) {
          std::shared_ptr<tchecker::parsing::system_declaration_t>::shared_ptr
                    (&local_520,(nullptr_t)0x0);
          std::shared_ptr<tchecker::parsing::system_declaration_t>::operator=
                    (this->system_declaration,&local_520);
          std::shared_ptr<tchecker::parsing::system_declaration_t>::~shared_ptr(&local_520);
        }
        break;
      case 4:
        std::shared_ptr<tchecker::parsing::system_declaration_t>::shared_ptr
                  ((shared_ptr<tchecker::parsing::system_declaration_t> *)
                   &exist_d.
                    super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(nullptr_t)0x0);
        std::shared_ptr<tchecker::parsing::system_declaration_t>::operator=
                  (this->system_declaration,
                   (shared_ptr<tchecker::parsing::system_declaration_t> *)
                   &exist_d.
                    super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::shared_ptr<tchecker::parsing::system_declaration_t>::~shared_ptr
                  ((shared_ptr<tchecker::parsing::system_declaration_t> *)
                   &exist_d.
                    super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        break;
      case 5:
        break;
      case 6:
        break;
      case 7:
        break;
      case 8:
        break;
      case 9:
        peVar14 = std::
                  __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this->system_declaration);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        value_type::as<std::__cxx11::string>
                  (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                    value);
        system_declaration_t::get_clock_declaration
                  ((system_declaration_t *)
                   &intd.
                    super___shared_ptr<const_tchecker::parsing::int_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(string *)peVar14);
        bVar2 = std::operator!=((shared_ptr<const_tchecker::parsing::clock_declaration_t> *)
                                &intd.
                                 super___shared_ptr<const_tchecker::parsing::int_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,(nullptr_t)0x0);
        if (bVar2) {
          poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar15 = system::operator<<(poVar7,&(psVar8->
                                               super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                               ).location);
          poVar7 = std::operator<<(pbVar15," multiple declarations of clock ");
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar20 = value_type::as<std::__cxx11::string>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          poVar7 = std::operator<<(poVar7,(string *)pbVar20);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          peVar14 = std::
                    __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this->system_declaration);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          value_type::as<std::__cxx11::string>
                    (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                      value);
          system_declaration_t::get_int_declaration
                    ((system_declaration_t *)local_550,(string *)peVar14);
          bVar2 = std::operator!=((shared_ptr<const_tchecker::parsing::int_declaration_t> *)
                                  local_550,(nullptr_t)0x0);
          if (bVar2) {
            poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,2);
            pbVar15 = system::operator<<(poVar7,&(psVar8->
                                                 super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                 ).location);
            poVar7 = std::operator<<(pbVar15," variable ");
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,2);
            pbVar20 = value_type::as<std::__cxx11::string>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            poVar7 = std::operator<<(poVar7,(string *)pbVar20);
            poVar7 = std::operator<<(poVar7," already declared as an int");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          else {
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)
                       &d.
                        super___shared_ptr<tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            system::operator<<(local_6c8,
                               (location *)
                               &yylhs.
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                                value.field_0x48);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,2);
            pbVar20 = value_type::as<std::__cxx11::string>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,4);
            paVar9 = (attributes_t *)
                     value_type::as<unsigned_int>
                               (&(psVar8->
                                 super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                 value);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,1);
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      value_type::as<tchecker::parsing::attributes_t>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            std::__cxx11::stringstream::str();
            std::
            make_shared<tchecker::parsing::clock_declaration_t,std::__cxx11::string&,unsigned_int&,tchecker::parsing::attributes_t&,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6e8,(uint *)pbVar20,paVar9,pbVar12);
            std::__cxx11::string::~string((string *)&e);
            peVar14 = std::
                      __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this->system_declaration);
            bVar2 = system_declaration_t::insert_clock_declaration
                              (peVar14,(shared_ptr<tchecker::parsing::clock_declaration_t> *)
                                       local_6e8);
            if (!bVar2) {
              poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
              pbVar15 = system::operator<<(poVar7,(location *)
                                                  &yylhs.
                                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                  .value.field_0x48);
              poVar7 = std::operator<<(pbVar15," insertion of clock declaration failed");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
            std::shared_ptr<tchecker::parsing::clock_declaration_t>::~shared_ptr
                      ((shared_ptr<tchecker::parsing::clock_declaration_t> *)local_6e8);
            std::__cxx11::stringstream::~stringstream
                      ((stringstream *)
                       &d.
                        super___shared_ptr<tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
          std::shared_ptr<const_tchecker::parsing::int_declaration_t>::~shared_ptr
                    ((shared_ptr<const_tchecker::parsing::int_declaration_t> *)local_550);
        }
        std::shared_ptr<const_tchecker::parsing::clock_declaration_t>::~shared_ptr
                  ((shared_ptr<const_tchecker::parsing::clock_declaration_t> *)
                   &intd.
                    super___shared_ptr<const_tchecker::parsing::int_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        break;
      case 10:
        peVar14 = std::
                  __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this->system_declaration);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,8);
        value_type::as<std::__cxx11::string>
                  (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                    value);
        system_declaration_t::get_process_declaration
                  ((system_declaration_t *)
                   &src.
                    super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(string *)peVar14);
        bVar2 = std::operator==((shared_ptr<const_tchecker::parsing::process_declaration_t> *)
                                &src.
                                 super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,(nullptr_t)0x0);
        if (bVar2) {
          poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,8);
          pbVar15 = system::operator<<(poVar7,&(psVar8->
                                               super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                               ).location);
          poVar7 = std::operator<<(pbVar15," process ");
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,8);
          pbVar20 = value_type::as<std::__cxx11::string>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          poVar7 = std::operator<<(poVar7,(string *)pbVar20);
          poVar7 = std::operator<<(poVar7," is not declared");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          peVar14 = std::
                    __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this->system_declaration);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,8);
          pbVar20 = value_type::as<std::__cxx11::string>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,6);
          value_type::as<std::__cxx11::string>
                    (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                      value);
          system_declaration_t::get_location_declaration
                    ((system_declaration_t *)
                     &tgt.
                      super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,(string *)peVar14,pbVar20);
          bVar2 = std::operator==((shared_ptr<const_tchecker::parsing::location_declaration_t> *)
                                  &tgt.
                                   super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount,(nullptr_t)0x0);
          if (bVar2) {
            poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,6);
            pbVar15 = system::operator<<(poVar7,&(psVar8->
                                                 super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                 ).location);
            poVar7 = std::operator<<(pbVar15," location ");
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,6);
            pbVar20 = value_type::as<std::__cxx11::string>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            poVar7 = std::operator<<(poVar7,(string *)pbVar20);
            poVar7 = std::operator<<(poVar7," is not declared in process ");
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,8);
            pbVar20 = value_type::as<std::__cxx11::string>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            poVar7 = std::operator<<(poVar7,(string *)pbVar20);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          else {
            peVar14 = std::
                      __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this->system_declaration);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,8);
            pbVar20 = value_type::as<std::__cxx11::string>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,4);
            value_type::as<std::__cxx11::string>
                      (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                        value);
            system_declaration_t::get_location_declaration
                      ((system_declaration_t *)
                       &event.
                        super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,(string *)peVar14,pbVar20);
            bVar2 = std::operator==((shared_ptr<const_tchecker::parsing::location_declaration_t> *)
                                    &event.
                                     super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount,(nullptr_t)0x0);
            if (bVar2) {
              poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
              psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                       ::operator[](&this->yystack_,4);
              pbVar15 = system::operator<<(poVar7,&(psVar8->
                                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                  ).location);
              poVar7 = std::operator<<(pbVar15," location ");
              psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                       ::operator[](&this->yystack_,4);
              pbVar20 = value_type::as<std::__cxx11::string>
                                  (&(psVar8->
                                    super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                    ).value);
              poVar7 = std::operator<<(poVar7,(string *)pbVar20);
              poVar7 = std::operator<<(poVar7," is not declared in process ");
              psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                       ::operator[](&this->yystack_,8);
              pbVar20 = value_type::as<std::__cxx11::string>
                                  (&(psVar8->
                                    super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                    ).value);
              poVar7 = std::operator<<(poVar7,(string *)pbVar20);
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
            else {
              peVar14 = std::
                        __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)this->system_declaration);
              psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                       ::operator[](&this->yystack_,2);
              value_type::as<std::__cxx11::string>
                        (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                          ).value);
              system_declaration_t::get_event_declaration
                        ((system_declaration_t *)local_750,(string *)peVar14);
              bVar2 = std::operator==((shared_ptr<const_tchecker::parsing::event_declaration_t> *)
                                      local_750,(nullptr_t)0x0);
              if (bVar2) {
                poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
                psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                         ::operator[](&this->yystack_,2);
                pbVar15 = system::operator<<(poVar7,&(psVar8->
                                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                  ).location);
                poVar7 = std::operator<<(pbVar15," event ");
                psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                         ::operator[](&this->yystack_,2);
                pbVar20 = value_type::as<std::__cxx11::string>
                                    (&(psVar8->
                                      super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                      ).value);
                poVar7 = std::operator<<(poVar7,(string *)pbVar20);
                poVar7 = std::operator<<(poVar7," is not declared");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              else {
                std::__cxx11::stringstream::stringstream
                          ((stringstream *)
                           &d_1.
                            super___shared_ptr<tchecker::parsing::edge_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                system::operator<<(local_8c8,
                                   (location *)
                                   &yylhs.
                                    super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                    .value.field_0x48);
                psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                         ::operator[](&this->yystack_,1);
                pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          value_type::as<tchecker::parsing::attributes_t>
                                    (&(psVar8->
                                      super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                      ).value);
                std::__cxx11::stringstream::str();
                std::
                make_shared<tchecker::parsing::edge_declaration_t,std::shared_ptr<tchecker::parsing::process_declaration_t_const>&,std::shared_ptr<tchecker::parsing::location_declaration_t_const>&,std::shared_ptr<tchecker::parsing::location_declaration_t_const>&,std::shared_ptr<tchecker::parsing::event_declaration_t_const>&,tchecker::parsing::attributes_t&,std::__cxx11::string>
                          ((shared_ptr<const_tchecker::parsing::process_declaration_t> *)local_8e8,
                           (shared_ptr<const_tchecker::parsing::location_declaration_t> *)
                           &src.
                            super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                           (shared_ptr<const_tchecker::parsing::location_declaration_t> *)
                           &tgt.
                            super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                           (shared_ptr<const_tchecker::parsing::event_declaration_t> *)
                           &event.
                            super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,(attributes_t *)local_750,pbVar20);
                std::__cxx11::string::~string(local_908);
                peVar14 = std::
                          __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)this->system_declaration);
                bVar2 = system_declaration_t::insert_edge_declaration
                                  (peVar14,(shared_ptr<tchecker::parsing::edge_declaration_t> *)
                                           local_8e8);
                if (!bVar2) {
                  poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
                  pbVar15 = system::operator<<(poVar7,(location *)
                                                      &yylhs.
                                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                  .value.field_0x48);
                  poVar7 = std::operator<<(pbVar15," insertion of edge declaration failed");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  std::shared_ptr<tchecker::parsing::edge_declaration_t>::shared_ptr
                            ((shared_ptr<tchecker::parsing::edge_declaration_t> *)&e_1,
                             (nullptr_t)0x0);
                  std::shared_ptr<tchecker::parsing::edge_declaration_t>::operator=
                            ((shared_ptr<tchecker::parsing::edge_declaration_t> *)local_8e8,
                             (shared_ptr<tchecker::parsing::edge_declaration_t> *)&e_1);
                  std::shared_ptr<tchecker::parsing::edge_declaration_t>::~shared_ptr
                            ((shared_ptr<tchecker::parsing::edge_declaration_t> *)&e_1);
                }
                std::shared_ptr<tchecker::parsing::edge_declaration_t>::~shared_ptr
                          ((shared_ptr<tchecker::parsing::edge_declaration_t> *)local_8e8);
                std::__cxx11::stringstream::~stringstream
                          ((stringstream *)
                           &d_1.
                            super___shared_ptr<tchecker::parsing::edge_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              }
              std::shared_ptr<const_tchecker::parsing::event_declaration_t>::~shared_ptr
                        ((shared_ptr<const_tchecker::parsing::event_declaration_t> *)local_750);
            }
            std::shared_ptr<const_tchecker::parsing::location_declaration_t>::~shared_ptr
                      ((shared_ptr<const_tchecker::parsing::location_declaration_t> *)
                       &event.
                        super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
          std::shared_ptr<const_tchecker::parsing::location_declaration_t>::~shared_ptr
                    ((shared_ptr<const_tchecker::parsing::location_declaration_t> *)
                     &tgt.
                      super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        std::shared_ptr<const_tchecker::parsing::process_declaration_t>::~shared_ptr
                  ((shared_ptr<const_tchecker::parsing::process_declaration_t> *)
                   &src.
                    super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        break;
      case 0xb:
        peVar14 = std::
                  __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this->system_declaration);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        value_type::as<std::__cxx11::string>
                  (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                    value);
        system_declaration_t::get_event_declaration
                  ((system_declaration_t *)local_930,(string *)peVar14);
        bVar2 = std::operator!=((shared_ptr<const_tchecker::parsing::event_declaration_t> *)
                                local_930,(nullptr_t)0x0);
        if (bVar2) {
          poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar15 = system::operator<<(poVar7,&(psVar8->
                                               super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                               ).location);
          poVar7 = std::operator<<(pbVar15," multiple declarations of event ");
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar20 = value_type::as<std::__cxx11::string>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          poVar7 = std::operator<<(poVar7,(string *)pbVar20);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)
                     &d_2.
                      super___shared_ptr<tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          system::operator<<(local_aa8,
                             (location *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                              value.field_0x48);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar20 = value_type::as<std::__cxx11::string>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,1);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    value_type::as<tchecker::parsing::attributes_t>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          std::__cxx11::stringstream::str();
          std::
          make_shared<tchecker::parsing::event_declaration_t,std::__cxx11::string&,tchecker::parsing::attributes_t&,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac8,
                     (attributes_t *)pbVar20,pbVar12);
          std::__cxx11::string::~string(local_ae8);
          peVar14 = std::
                    __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this->system_declaration);
          bVar2 = system_declaration_t::insert_event_declaration
                            (peVar14,(shared_ptr<tchecker::parsing::event_declaration_t> *)local_ac8
                            );
          if (!bVar2) {
            poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
            pbVar15 = system::operator<<(poVar7,(location *)
                                                &yylhs.
                                                 super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                 .value.field_0x48);
            poVar7 = std::operator<<(pbVar15," insertion of event declaration failed");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            std::shared_ptr<tchecker::parsing::event_declaration_t>::shared_ptr
                      ((shared_ptr<tchecker::parsing::event_declaration_t> *)&e_2,(nullptr_t)0x0);
            std::shared_ptr<tchecker::parsing::event_declaration_t>::operator=
                      ((shared_ptr<tchecker::parsing::event_declaration_t> *)local_ac8,
                       (shared_ptr<tchecker::parsing::event_declaration_t> *)&e_2);
            std::shared_ptr<tchecker::parsing::event_declaration_t>::~shared_ptr
                      ((shared_ptr<tchecker::parsing::event_declaration_t> *)&e_2);
          }
          std::shared_ptr<tchecker::parsing::event_declaration_t>::~shared_ptr
                    ((shared_ptr<tchecker::parsing::event_declaration_t> *)local_ac8);
          std::__cxx11::stringstream::~stringstream
                    ((stringstream *)
                     &d_2.
                      super___shared_ptr<tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        std::shared_ptr<const_tchecker::parsing::event_declaration_t>::~shared_ptr
                  ((shared_ptr<const_tchecker::parsing::event_declaration_t> *)local_930);
        break;
      case 0xc:
        peVar14 = std::
                  __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this->system_declaration);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        value_type::as<std::__cxx11::string>
                  (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                    value);
        system_declaration_t::get_int_declaration
                  ((system_declaration_t *)
                   &clockd.
                    super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(string *)peVar14);
        bVar2 = std::operator!=((shared_ptr<const_tchecker::parsing::int_declaration_t> *)
                                &clockd.
                                 super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,(nullptr_t)0x0);
        if (bVar2) {
          poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar15 = system::operator<<(poVar7,&(psVar8->
                                               super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                               ).location);
          poVar7 = std::operator<<(pbVar15," multiple declarations of int variable ");
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar20 = value_type::as<std::__cxx11::string>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          poVar7 = std::operator<<(poVar7,(string *)pbVar20);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          peVar14 = std::
                    __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this->system_declaration);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          value_type::as<std::__cxx11::string>
                    (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                      value);
          system_declaration_t::get_clock_declaration
                    ((system_declaration_t *)local_b20,(string *)peVar14);
          bVar2 = std::operator!=((shared_ptr<const_tchecker::parsing::clock_declaration_t> *)
                                  local_b20,(nullptr_t)0x0);
          if (bVar2) {
            poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,2);
            pbVar15 = system::operator<<(poVar7,&(psVar8->
                                                 super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                 ).location);
            poVar7 = std::operator<<(pbVar15," variable ");
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,2);
            pbVar20 = value_type::as<std::__cxx11::string>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            poVar7 = std::operator<<(poVar7,(string *)pbVar20);
            poVar7 = std::operator<<(poVar7," already declared as a clock");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          else {
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)
                       &d_3.
                        super___shared_ptr<tchecker::parsing::int_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            system::operator<<(local_c98,
                               (location *)
                               &yylhs.
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                                value.field_0x48);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,2);
            pbVar20 = value_type::as<std::__cxx11::string>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,10);
            puVar23 = value_type::as<unsigned_int>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,8);
            piVar19 = value_type::as<int>(&(psVar8->
                                           super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                           ).value);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,6);
            __args_4 = value_type::as<int>(&(psVar8->
                                            super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                            ).value);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,4);
            paVar9 = (attributes_t *)
                     value_type::as<int>(&(psVar8->
                                          super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                          ).value);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,1);
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      value_type::as<tchecker::parsing::attributes_t>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            std::__cxx11::stringstream::str();
            std::
            make_shared<tchecker::parsing::int_declaration_t,std::__cxx11::string&,unsigned_int&,int&,int&,int&,tchecker::parsing::attributes_t&,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_cb8,(uint *)pbVar20,(int *)puVar23,piVar19,__args_4,paVar9,pbVar12);
            std::__cxx11::string::~string(local_cd8);
            peVar14 = std::
                      __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this->system_declaration);
            bVar2 = system_declaration_t::insert_int_declaration
                              (peVar14,(shared_ptr<tchecker::parsing::int_declaration_t> *)local_cb8
                              );
            if (!bVar2) {
              poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
              pbVar15 = system::operator<<(poVar7,(location *)
                                                  &yylhs.
                                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                  .value.field_0x48);
              poVar7 = std::operator<<(pbVar15," insertion of int declaration failed");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              std::shared_ptr<tchecker::parsing::int_declaration_t>::shared_ptr
                        ((shared_ptr<tchecker::parsing::int_declaration_t> *)&e_3,(nullptr_t)0x0);
              std::shared_ptr<tchecker::parsing::int_declaration_t>::operator=
                        ((shared_ptr<tchecker::parsing::int_declaration_t> *)local_cb8,
                         (shared_ptr<tchecker::parsing::int_declaration_t> *)&e_3);
              std::shared_ptr<tchecker::parsing::int_declaration_t>::~shared_ptr
                        ((shared_ptr<tchecker::parsing::int_declaration_t> *)&e_3);
            }
            std::shared_ptr<tchecker::parsing::int_declaration_t>::~shared_ptr
                      ((shared_ptr<tchecker::parsing::int_declaration_t> *)local_cb8);
            std::__cxx11::stringstream::~stringstream
                      ((stringstream *)
                       &d_3.
                        super___shared_ptr<tchecker::parsing::int_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
          std::shared_ptr<const_tchecker::parsing::clock_declaration_t>::~shared_ptr
                    ((shared_ptr<const_tchecker::parsing::clock_declaration_t> *)local_b20);
        }
        std::shared_ptr<const_tchecker::parsing::int_declaration_t>::~shared_ptr
                  ((shared_ptr<const_tchecker::parsing::int_declaration_t> *)
                   &clockd.
                    super___shared_ptr<const_tchecker::parsing::clock_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        break;
      case 0xd:
        peVar14 = std::
                  __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this->system_declaration);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,4);
        pbVar20 = value_type::as<std::__cxx11::string>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        value_type::as<std::__cxx11::string>
                  (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                    value);
        system_declaration_t::get_location_declaration
                  ((system_declaration_t *)
                   &proc_1.
                    super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(string *)peVar14,pbVar20);
        bVar2 = std::operator!=((shared_ptr<const_tchecker::parsing::location_declaration_t> *)
                                &proc_1.
                                 super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,(nullptr_t)0x0);
        if (bVar2) {
          poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar15 = system::operator<<(poVar7,&(psVar8->
                                               super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                               ).location);
          poVar7 = std::operator<<(pbVar15," multiple declarations of location ");
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar20 = value_type::as<std::__cxx11::string>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          poVar7 = std::operator<<(poVar7,(string *)pbVar20);
          poVar7 = std::operator<<(poVar7," in process ");
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,4);
          pbVar20 = value_type::as<std::__cxx11::string>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          poVar7 = std::operator<<(poVar7,(string *)pbVar20);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          peVar14 = std::
                    __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this->system_declaration);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,4);
          value_type::as<std::__cxx11::string>
                    (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                      value);
          system_declaration_t::get_process_declaration
                    ((system_declaration_t *)local_d10,(string *)peVar14);
          bVar2 = std::operator==((shared_ptr<const_tchecker::parsing::process_declaration_t> *)
                                  local_d10,(nullptr_t)0x0);
          if (bVar2) {
            poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,4);
            pbVar15 = system::operator<<(poVar7,&(psVar8->
                                                 super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                 ).location);
            poVar7 = std::operator<<(pbVar15," process ");
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,4);
            pbVar20 = value_type::as<std::__cxx11::string>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            poVar7 = std::operator<<(poVar7,(string *)pbVar20);
            poVar7 = std::operator<<(poVar7," is not declared");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          else {
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)
                       &d_4.
                        super___shared_ptr<tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            system::operator<<(local_e88,
                               (location *)
                               &yylhs.
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                                value.field_0x48);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,2);
            pbVar20 = value_type::as<std::__cxx11::string>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,1);
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      value_type::as<tchecker::parsing::attributes_t>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            std::__cxx11::stringstream::str();
            std::
            make_shared<tchecker::parsing::location_declaration_t,std::__cxx11::string&,std::shared_ptr<tchecker::parsing::process_declaration_t_const>&,tchecker::parsing::attributes_t&,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_ea8,
                       (shared_ptr<const_tchecker::parsing::process_declaration_t> *)pbVar20,
                       (attributes_t *)local_d10,pbVar12);
            std::__cxx11::string::~string(local_ec8);
            peVar14 = std::
                      __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this->system_declaration);
            bVar2 = system_declaration_t::insert_location_declaration
                              (peVar14,(shared_ptr<tchecker::parsing::location_declaration_t> *)
                                       local_ea8);
            if (!bVar2) {
              poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
              pbVar15 = system::operator<<(poVar7,(location *)
                                                  &yylhs.
                                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                  .value.field_0x48);
              poVar7 = std::operator<<(pbVar15," insertion of location declaration failed");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              std::shared_ptr<tchecker::parsing::location_declaration_t>::shared_ptr
                        ((shared_ptr<tchecker::parsing::location_declaration_t> *)&e_4,
                         (nullptr_t)0x0);
              std::shared_ptr<tchecker::parsing::location_declaration_t>::operator=
                        ((shared_ptr<tchecker::parsing::location_declaration_t> *)local_ea8,
                         (shared_ptr<tchecker::parsing::location_declaration_t> *)&e_4);
              std::shared_ptr<tchecker::parsing::location_declaration_t>::~shared_ptr
                        ((shared_ptr<tchecker::parsing::location_declaration_t> *)&e_4);
            }
            std::shared_ptr<tchecker::parsing::location_declaration_t>::~shared_ptr
                      ((shared_ptr<tchecker::parsing::location_declaration_t> *)local_ea8);
            std::__cxx11::stringstream::~stringstream
                      ((stringstream *)
                       &d_4.
                        super___shared_ptr<tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
          std::shared_ptr<const_tchecker::parsing::process_declaration_t>::~shared_ptr
                    ((shared_ptr<const_tchecker::parsing::process_declaration_t> *)local_d10);
        }
        std::shared_ptr<const_tchecker::parsing::location_declaration_t>::~shared_ptr
                  ((shared_ptr<const_tchecker::parsing::location_declaration_t> *)
                   &proc_1.
                    super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        break;
      case 0xe:
        peVar14 = std::
                  __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this->system_declaration);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        value_type::as<std::__cxx11::string>
                  (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                    value);
        system_declaration_t::get_process_declaration
                  ((system_declaration_t *)local_ef0,(string *)peVar14);
        bVar2 = std::operator!=((shared_ptr<const_tchecker::parsing::process_declaration_t> *)
                                local_ef0,(nullptr_t)0x0);
        if (bVar2) {
          poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar15 = system::operator<<(poVar7,&(psVar8->
                                               super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                               ).location);
          poVar7 = std::operator<<(pbVar15," multiple declarations of process ");
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar20 = value_type::as<std::__cxx11::string>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          poVar7 = std::operator<<(poVar7,(string *)pbVar20);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)
                     &d_5.
                      super___shared_ptr<tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          system::operator<<(local_1068,
                             (location *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                              value.field_0x48);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pbVar20 = value_type::as<std::__cxx11::string>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,1);
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    value_type::as<tchecker::parsing::attributes_t>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          std::__cxx11::stringstream::str();
          std::
          make_shared<tchecker::parsing::process_declaration_t,std::__cxx11::string&,tchecker::parsing::attributes_t&,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1088
                     ,(attributes_t *)pbVar20,pbVar12);
          std::__cxx11::string::~string(local_10a8);
          peVar14 = std::
                    __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this->system_declaration);
          bVar2 = system_declaration_t::insert_process_declaration
                            (peVar14,(shared_ptr<tchecker::parsing::process_declaration_t> *)
                                     local_1088);
          if (!bVar2) {
            poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,0);
            pbVar15 = system::operator<<(poVar7,&(psVar8->
                                                 super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                 ).location);
            poVar7 = std::operator<<(pbVar15," insertion of process declaration failed");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            std::shared_ptr<tchecker::parsing::process_declaration_t>::shared_ptr
                      ((shared_ptr<tchecker::parsing::process_declaration_t> *)&e_5,(nullptr_t)0x0);
            std::shared_ptr<tchecker::parsing::process_declaration_t>::operator=
                      ((shared_ptr<tchecker::parsing::process_declaration_t> *)local_1088,
                       (shared_ptr<tchecker::parsing::process_declaration_t> *)&e_5);
            std::shared_ptr<tchecker::parsing::process_declaration_t>::~shared_ptr
                      ((shared_ptr<tchecker::parsing::process_declaration_t> *)&e_5);
          }
          std::shared_ptr<tchecker::parsing::process_declaration_t>::~shared_ptr
                    ((shared_ptr<tchecker::parsing::process_declaration_t> *)local_1088);
          std::__cxx11::stringstream::~stringstream
                    ((stringstream *)
                     &d_5.
                      super___shared_ptr<tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        std::shared_ptr<const_tchecker::parsing::process_declaration_t>::~shared_ptr
                  ((shared_ptr<const_tchecker::parsing::process_declaration_t> *)local_ef0);
        break;
      case 0xf:
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)
                   &d_6.
                    super___shared_ptr<tchecker::parsing::sync_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        system::operator<<(local_1238,
                           (location *)
                           &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                            value.field_0x48);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        paVar9 = (attributes_t *)
                 value_type::
                 as<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                           (&(psVar8->
                             super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                             value);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  value_type::as<tchecker::parsing::attributes_t>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        std::__cxx11::stringstream::str();
        std::
        make_shared<tchecker::parsing::sync_declaration_t,std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>&,tchecker::parsing::attributes_t&,std::__cxx11::string>
                  ((vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
                    *)local_1258,paVar9,pbVar20);
        std::__cxx11::string::~string(local_1278);
        peVar14 = std::
                  __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this->system_declaration);
        bVar2 = system_declaration_t::insert_sync_declaration
                          (peVar14,(shared_ptr<tchecker::parsing::sync_declaration_t> *)local_1258);
        if (!bVar2) {
          poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
          pbVar15 = system::operator<<(poVar7,(location *)
                                              &yylhs.
                                               super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                               .value.field_0x48);
          poVar7 = std::operator<<(pbVar15," insertion of sync declaration failed");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::shared_ptr<tchecker::parsing::sync_declaration_t>::shared_ptr
                    ((shared_ptr<tchecker::parsing::sync_declaration_t> *)&e_6,(nullptr_t)0x0);
          std::shared_ptr<tchecker::parsing::sync_declaration_t>::operator=
                    ((shared_ptr<tchecker::parsing::sync_declaration_t> *)local_1258,
                     (shared_ptr<tchecker::parsing::sync_declaration_t> *)&e_6);
          std::shared_ptr<tchecker::parsing::sync_declaration_t>::~shared_ptr
                    ((shared_ptr<tchecker::parsing::sync_declaration_t> *)&e_6);
        }
        std::shared_ptr<tchecker::parsing::sync_declaration_t>::~shared_ptr
                  ((shared_ptr<tchecker::parsing::sync_declaration_t> *)local_1258);
        std::__cxx11::stringstream::~stringstream
                  ((stringstream *)
                   &d_6.
                    super___shared_ptr<tchecker::parsing::sync_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        break;
      default:
        break;
      case 0x11:
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,1);
        paVar9 = value_type::as<tchecker::parsing::attributes_t>
                           (&(psVar8->
                             super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                             value);
        paVar10 = value_type::as<tchecker::parsing::attributes_t>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                              field_0x8);
        attributes_t::operator=(paVar10,paVar9);
        break;
      case 0x12:
        paVar9 = value_type::as<tchecker::parsing::attributes_t>
                           ((value_type *)
                            &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                             .field_0x8);
        attributes_t::clear(paVar9);
        break;
      case 0x13:
        paVar9 = value_type::as<tchecker::parsing::attributes_t>
                           ((value_type *)
                            &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                             .field_0x8);
        attributes_t::clear(paVar9);
        break;
      case 0x14:
        paVar9 = value_type::as<tchecker::parsing::attributes_t>
                           ((value_type *)
                            &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                             .field_0x8);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar11 = value_type::as<std::shared_ptr<tchecker::parsing::attr_t>>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        attributes_t::insert(paVar9,psVar11);
        break;
      case 0x15:
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        paVar9 = value_type::as<tchecker::parsing::attributes_t>
                           (&(psVar8->
                             super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                             value);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar11 = value_type::as<std::shared_ptr<tchecker::parsing::attr_t>>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        attributes_t::insert(paVar9,psVar11);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        paVar9 = value_type::as<tchecker::parsing::attributes_t>
                           (&(psVar8->
                             super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                             value);
        paVar10 = value_type::as<tchecker::parsing::attributes_t>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                              field_0x8);
        attributes_t::operator=(paVar10,paVar9);
        break;
      case 0x16:
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        pbVar20 = value_type::as<std::__cxx11::string>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        bVar2 = std::operator==(pbVar20,"");
        if (bVar2) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"empty tokens should not be accepted by the parser");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::stringstream::stringstream(local_1418);
        std::__cxx11::stringstream::stringstream(local_15a0);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        system::operator<<(local_1408,
                           &(psVar8->
                            super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                            location);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        system::operator<<(local_1590,
                           &(psVar8->
                            super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                            location);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        pbVar20 = value_type::as<std::__cxx11::string>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        std::locale::locale((locale *)(local_15b8 + 0x10));
        boost::algorithm::trim<std::__cxx11::string>(pbVar20,(locale *)(local_15b8 + 0x10));
        std::locale::~locale((locale *)(local_15b8 + 0x10));
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        pbVar20 = value_type::as<std::__cxx11::string>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        __args_2 = (attr_parsing_position_t *)
                   value_type::as<std::__cxx11::string>
                             (&(psVar8->
                               super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                               value);
        std::__cxx11::stringstream::str();
        std::__cxx11::stringstream::str();
        attr_parsing_position_t::attr_parsing_position_t
                  (&local_15f8,&local_1618,
                   (string *)
                   &proc_2.
                    super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::
        make_shared<tchecker::parsing::attr_t,std::__cxx11::string&,std::__cxx11::string&,tchecker::parsing::attr_parsing_position_t>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15b8,
                   pbVar20,__args_2);
        psVar11 = value_type::as<std::shared_ptr<tchecker::parsing::attr_t>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                              field_0x8);
        std::shared_ptr<tchecker::parsing::attr_t>::operator=
                  (psVar11,(shared_ptr<tchecker::parsing::attr_t> *)local_15b8);
        std::shared_ptr<tchecker::parsing::attr_t>::~shared_ptr
                  ((shared_ptr<tchecker::parsing::attr_t> *)local_15b8);
        attr_parsing_position_t::~attr_parsing_position_t(&local_15f8);
        std::__cxx11::string::~string
                  ((string *)
                   &proc_2.
                    super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::string::~string((string *)&local_1618);
        std::__cxx11::stringstream::~stringstream(local_15a0);
        std::__cxx11::stringstream::~stringstream(local_1418);
        break;
      case 0x17:
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        pbVar20 = value_type::as<std::__cxx11::string>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        pbVar12 = value_type::as<std::__cxx11::string>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                              field_0x8);
        std::__cxx11::string::operator=((string *)pbVar12,(string *)pbVar20);
        break;
      case 0x18:
        value_type::as<std::__cxx11::string>
                  ((value_type *)
                   &yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                    field_0x8);
        std::__cxx11::string::clear();
        break;
      case 0x19:
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar16 = value_type::as<std::shared_ptr<tchecker::parsing::sync_constraint_t>>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        bVar2 = std::operator!=(psVar16,(nullptr_t)0x0);
        if (bVar2) {
          pvVar13 = value_type::
                    as<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                              ((value_type *)
                               &yylhs.
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                                field_0x8);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,0);
          psVar16 = value_type::as<std::shared_ptr<tchecker::parsing::sync_constraint_t>>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          std::
          vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
          ::push_back(pvVar13,psVar16);
        }
        break;
      case 0x1a:
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        psVar16 = value_type::as<std::shared_ptr<tchecker::parsing::sync_constraint_t>>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        bVar2 = std::operator!=(psVar16,(nullptr_t)0x0);
        if (bVar2) {
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,2);
          pvVar13 = value_type::
                    as<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,0);
          psVar16 = value_type::as<std::shared_ptr<tchecker::parsing::sync_constraint_t>>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          std::
          vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
          ::push_back(pvVar13,psVar16);
        }
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,2);
        pvVar13 = value_type::
                  as<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        this_01 = value_type::
                  as<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                              field_0x8);
        std::
        vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
        ::operator=(this_01,pvVar13);
        break;
      case 0x1b:
        peVar14 = std::
                  __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this->system_declaration);
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,3);
        value_type::as<std::__cxx11::string>
                  (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                    value);
        system_declaration_t::get_process_declaration
                  ((system_declaration_t *)
                   &event_1.
                    super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(string *)peVar14);
        bVar2 = std::operator==((shared_ptr<const_tchecker::parsing::process_declaration_t> *)
                                &event_1.
                                 super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,(nullptr_t)0x0);
        if (bVar2) {
          poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,3);
          pbVar15 = system::operator<<(poVar7,&(psVar8->
                                               super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                               ).location);
          poVar7 = std::operator<<(pbVar15," process ");
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,3);
          pbVar20 = value_type::as<std::__cxx11::string>
                              (&(psVar8->
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                                value);
          poVar7 = std::operator<<(poVar7,(string *)pbVar20);
          poVar7 = std::operator<<(poVar7," is not declared");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          peVar14 = std::
                    __shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this->system_declaration);
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,1);
          value_type::as<std::__cxx11::string>
                    (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                      value);
          system_declaration_t::get_event_declaration
                    ((system_declaration_t *)local_1658,(string *)peVar14);
          bVar2 = std::operator==((shared_ptr<const_tchecker::parsing::event_declaration_t> *)
                                  local_1658,(nullptr_t)0x0);
          if (bVar2) {
            poVar7 = tchecker::operator<<((ostream *)&std::cerr,(log_error_t *)&log_error);
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,1);
            pbVar15 = system::operator<<(poVar7,&(psVar8->
                                                 super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                                 ).location);
            poVar7 = std::operator<<(pbVar15," event ");
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,1);
            pbVar20 = value_type::as<std::__cxx11::string>
                                (&(psVar8->
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>)
                                  .value);
            poVar7 = std::operator<<(poVar7,(string *)pbVar20);
            poVar7 = std::operator<<(poVar7," is not declared");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          else {
            psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,0);
            value_type::as<tchecker::sync_strength_t>
                      (&(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                        value);
            std::
            make_shared<tchecker::parsing::sync_constraint_t,std::shared_ptr<tchecker::parsing::process_declaration_t_const>&,std::shared_ptr<tchecker::parsing::event_declaration_t_const>&,tchecker::sync_strength_t&>
                      ((shared_ptr<const_tchecker::parsing::process_declaration_t> *)&l,
                       (shared_ptr<const_tchecker::parsing::event_declaration_t> *)
                       &event_1.
                        super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,(sync_strength_t *)local_1658);
            psVar16 = value_type::as<std::shared_ptr<tchecker::parsing::sync_constraint_t>>
                                ((value_type *)
                                 &yylhs.
                                  super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                                  field_0x8);
            std::shared_ptr<tchecker::parsing::sync_constraint_t>::operator=
                      (psVar16,(shared_ptr<tchecker::parsing::sync_constraint_t> *)&l);
            std::shared_ptr<tchecker::parsing::sync_constraint_t>::~shared_ptr
                      ((shared_ptr<tchecker::parsing::sync_constraint_t> *)&l);
          }
          std::shared_ptr<const_tchecker::parsing::event_declaration_t>::~shared_ptr
                    ((shared_ptr<const_tchecker::parsing::event_declaration_t> *)local_1658);
        }
        std::shared_ptr<const_tchecker::parsing::process_declaration_t>::~shared_ptr
                  ((shared_ptr<const_tchecker::parsing::process_declaration_t> *)
                   &event_1.
                    super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        break;
      case 0x1c:
        psVar17 = value_type::as<tchecker::sync_strength_t>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                              field_0x8);
        *psVar17 = SYNC_WEAK;
        break;
      case 0x1d:
        psVar17 = value_type::as<tchecker::sync_strength_t>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                              field_0x8);
        *psVar17 = SYNC_STRONG;
        break;
      case 0x22:
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        pbVar20 = value_type::as<std::__cxx11::string>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        lVar18 = std::__cxx11::stoll(pbVar20,(size_t *)0x0,10);
        iVar4 = std::numeric_limits<int>::min();
        if ((lVar18 < iVar4) || (iVar4 = std::numeric_limits<int>::max(), iVar4 < lVar18)) {
          poVar22 = (out_of_range *)__cxa_allocate_exception(0x10);
          std::out_of_range::out_of_range(poVar22,"integer constant our of range");
          __cxa_throw(poVar22,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
        }
        piVar19 = value_type::as<int>((value_type *)
                                      &yylhs.
                                       super_basic_symbol<tchecker::parsing::system::parser_t::by_state>
                                       .field_0x8);
        *piVar19 = (int)lVar18;
        break;
      case 0x23:
        psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                 ::operator[](&this->yystack_,0);
        pbVar20 = value_type::as<std::__cxx11::string>
                            (&(psVar8->
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                              value);
        uVar21 = std::__cxx11::stoul(pbVar20,(size_t *)0x0,10);
        uVar5 = std::numeric_limits<unsigned_int>::max();
        if (uVar5 < uVar21) {
          poVar22 = (out_of_range *)__cxa_allocate_exception(0x10);
          std::out_of_range::out_of_range(poVar22,"unsigned integer out of range");
          __cxa_throw(poVar22,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
        }
        puVar23 = value_type::as<unsigned_int>
                            ((value_type *)
                             &yylhs.
                              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                              field_0x8);
        *puVar23 = (uint)uVar21;
      }
      if (this->yydebug_ != 0) {
        poVar7 = std::operator<<(this->yycdebug_,"-> $$ =");
        std::operator<<(poVar7,' ');
        yy_print_<tchecker::parsing::system::parser_t::by_state>
                  (this,this->yycdebug_,
                   (basic_symbol<tchecker::parsing::system::parser_t::by_state> *)&range.range_);
        std::operator<<(this->yycdebug_,'\n');
      }
      yypop_(this,iVar6);
      yypush_(this,(char *)0x0,(stack_symbol_type *)&range.range_);
      yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.end.column =
           0;
      stack_symbol_type::~stack_symbol_type((stack_symbol_type *)&range.range_);
      if (yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.end.
          column != 0) {
        if (yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.end.
            column != 0x13) goto LAB_002e1f4d;
        yypop_(this,0);
        if (this->yydebug_ != 0) {
          (*this->_vptr_parser_t[6])();
        }
LAB_002e1b19:
        yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.line = 3;
        while( true ) {
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,0);
          cVar1 = yypact_[(int)(psVar8->
                               super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                               super_by_state.state];
          bVar2 = yy_pact_value_is_default_((int)cVar1);
          if (((!bVar2) && (iVar6 = cVar1 + 1, -1 < iVar6)) &&
             ((iVar6 < 0x70 &&
              ((yycheck_[iVar6] == '\x01' && (cVar1 = yytable_[iVar6], '\0' < cVar1)))))) break;
          iVar24 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::size(&this->yystack_);
          if (iVar24 == 1) goto LAB_002e1d88;
          psVar8 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                   ::operator[](&this->yystack_,0);
          yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.value.
          _72_8_ = (psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                   location.begin.filename;
          yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
          location.begin.filename =
               *(filename_type **)
                &(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                 location.begin.line;
          yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
          location.begin._8_8_ =
               (psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.
               end.filename;
          yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
          location.end.filename =
               *(filename_type **)
                &(psVar8->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                 location.end.line;
          pbVar25 = &stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                     ::operator[](&this->yystack_,0)->
                     super_basic_symbol<tchecker::parsing::system::parser_t::by_state>;
          yy_destroy_<tchecker::parsing::system::parser_t::by_state>(this,"Error: popping",pbVar25);
          yypop_(this,1);
          if (this->yydebug_ != 0) {
            (*this->_vptr_parser_t[6])();
          }
        }
        stack_symbol_type::stack_symbol_type((stack_symbol_type *)local_1748);
        yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.value.
        _72_8_ = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.value._72_8_;
        yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
        begin.filename =
             yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.begin.
             filename;
        yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
        begin.line = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.
                     begin.line;
        yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
        begin.column = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.
                       location.begin.column;
        yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
        end.filename = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.
                       location.end.filename;
        error_token.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.value._72_8_ =
             yyerror_range[1].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
             value._72_8_;
        error_token.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.begin
        .filename = yyerror_range[1].
                    super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.begin
                    .filename;
        error_token.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.begin
        .line = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.begin
                .line;
        error_token.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.begin
        .column = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.
                  begin.column;
        error_token.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.end.
        filename = yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.
                   end.filename;
        local_1748[0] = cVar1;
        yypush_(this,"Shifting",(stack_symbol_type *)local_1748);
        stack_symbol_type::~stack_symbol_type((stack_symbol_type *)local_1748);
      }
    }
    else {
      bVar2 = basic_symbol<tchecker::parsing::system::parser_t::by_kind>::empty
                        ((basic_symbol<tchecker::parsing::system::parser_t::by_kind> *)
                         &yyerror_range[2].
                          super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location
                          .end.line);
      if (bVar2) {
        if (this->yydebug_ != 0) {
          std::operator<<(this->yycdebug_,"Reading a token\n");
        }
        spyylex((symbol_type *)&yyexc,this->filename,this->system_declaration);
        basic_symbol<tchecker::parsing::system::parser_t::by_kind>::move
                  ((basic_symbol<tchecker::parsing::system::parser_t::by_kind> *)
                   &yyerror_range[2].
                    super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.end.
                    line,(basic_symbol<tchecker::parsing::system::parser_t::by_kind> *)&yyexc);
        symbol_type::~symbol_type((symbol_type *)&yyexc);
      }
      if (this->yydebug_ != 0) {
        poVar7 = std::operator<<(this->yycdebug_,"Next token is");
        std::operator<<(poVar7,' ');
        yy_print_<tchecker::parsing::system::parser_t::by_kind>
                  (this,this->yycdebug_,
                   (basic_symbol<tchecker::parsing::system::parser_t::by_kind> *)
                   &yyerror_range[2].
                    super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.end.
                    line);
        std::operator<<(this->yycdebug_,'\n');
      }
      sVar3 = by_kind::kind((by_kind *)
                            &yyerror_range[2].
                             super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                             location.end.line);
      if (sVar3 == S_YYerror) {
        yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.
        end.line = 2;
        goto LAB_002e1b19;
      }
      sVar3 = by_kind::kind((by_kind *)
                            &yyerror_range[2].
                             super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                             location.end.line);
      iVar6 = sVar3 + cVar1;
      if (((iVar6 < 0) || (0x6f < iVar6)) ||
         (cVar1 = yycheck_[iVar6],
         sVar3 = by_kind::kind((by_kind *)
                               &yyerror_range[2].
                                super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                                location.end.line), cVar1 != sVar3)) goto LAB_002dd6f4;
      iVar4 = (int)(char)yytable_[iVar6];
      if (iVar4 < 1) {
        bVar2 = yy_table_value_is_error_(iVar4);
        if (!bVar2) {
          yynerrs_ = -iVar4;
          goto LAB_002dd739;
        }
        goto LAB_002e19ba;
      }
      if (yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.line !=
          0) {
        yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.line =
             yyla.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.line
             + -1;
      }
      yypush_(this,"Shifting",yytable_[iVar6],
              (symbol_type *)
              &yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
               location.end.line);
    }
  }
  yylookahead.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.line = 0
  ;
LAB_002e1d92:
  bVar2 = basic_symbol<tchecker::parsing::system::parser_t::by_kind>::empty
                    ((basic_symbol<tchecker::parsing::system::parser_t::by_kind> *)
                     &yyerror_range[2].
                      super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.end
                      .line);
  if (!bVar2) {
    yy_destroy_<tchecker::parsing::system::parser_t::by_kind>
              (this,"Cleanup: discarding lookahead",
               (basic_symbol<tchecker::parsing::system::parser_t::by_kind> *)
               &yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                location.end.line);
  }
  yypop_(this,0);
  if (this->yydebug_ != 0) {
    (*this->_vptr_parser_t[6])();
  }
  while (iVar24 = stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
                  ::size(&this->yystack_), 1 < iVar24) {
    pbVar25 = &stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
               ::operator[](&this->yystack_,0)->
               super_basic_symbol<tchecker::parsing::system::parser_t::by_state>;
    yy_destroy_<tchecker::parsing::system::parser_t::by_state>(this,"Cleanup: popping",pbVar25);
    yypop_(this,1);
  }
  this_local._4_4_ =
       yylookahead.super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>.location.end.
       line;
  yylhs.super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.location.end.column = 1;
LAB_002e1f4d:
  local_21a0 = &yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
                location.end.line;
  do {
    local_21a0 = local_21a0 + -0x20;
    stack_symbol_type::~stack_symbol_type((stack_symbol_type *)local_21a0);
  } while (local_21a0 != (counter_type *)local_228);
  symbol_type::~symbol_type
            ((symbol_type *)
             &yyerror_range[2].super_basic_symbol<tchecker::parsing::system::parser_t::by_state>.
              location.end.line);
  return this_local._4_4_;
}

Assistant:

int
  parser_t::parse ()
  {
    int yyn;
    /// Length of the RHS of the rule being reduced.
    int yylen = 0;

    // Error handling.
    int yynerrs_ = 0;
    int yyerrstatus_ = 0;

    /// The lookahead symbol.
    symbol_type yyla;

    /// The locations where the error started and ended.
    stack_symbol_type yyerror_range[3];

    /// The return value of parse ().
    int yyresult;

#if YY_EXCEPTIONS
    try
#endif // YY_EXCEPTIONS
      {
    YYCDEBUG << "Starting parse\n";


    // User initialization code.
#line 55 "system.yy"
{
  // Initialize the initial location.
  yyla.location.begin.filename = yyla.location.end.filename = &const_cast<std::string &>(filename);
  
  old_error_count = tchecker::log_error_count();
}

#line 646 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"


    /* Initialize the stack.  The initial state will be set in
       yynewstate, since the latter expects the semantical and the
       location values to have been already stored, initialize these
       stacks with a primary value.  */
    yystack_.clear ();
    yypush_ (YY_NULLPTR, 0, YY_MOVE (yyla));

  /*-----------------------------------------------.
  | yynewstate -- push a new symbol on the stack.  |
  `-----------------------------------------------*/
  yynewstate:
    YYCDEBUG << "Entering state " << int (yystack_[0].state) << '\n';
    YY_STACK_PRINT ();

    // Accept?
    if (yystack_[0].state == yyfinal_)
      YYACCEPT;

    goto yybackup;


  /*-----------.
  | yybackup.  |
  `-----------*/
  yybackup:
    // Try to take a decision without lookahead.
    yyn = yypact_[+yystack_[0].state];
    if (yy_pact_value_is_default_ (yyn))
      goto yydefault;

    // Read a lookahead token.
    if (yyla.empty ())
      {
        YYCDEBUG << "Reading a token\n";
#if YY_EXCEPTIONS
        try
#endif // YY_EXCEPTIONS
          {
            symbol_type yylookahead (yylex (filename, system_declaration));
            yyla.move (yylookahead);
          }
#if YY_EXCEPTIONS
        catch (const syntax_error& yyexc)
          {
            YYCDEBUG << "Caught exception: " << yyexc.what() << '\n';
            error (yyexc);
            goto yyerrlab1;
          }
#endif // YY_EXCEPTIONS
      }
    YY_SYMBOL_PRINT ("Next token is", yyla);

    if (yyla.kind () == symbol_kind::S_YYerror)
    {
      // The scanner already issued an error message, process directly
      // to error recovery.  But do not keep the error token as
      // lookahead, it is too special and may lead us to an endless
      // loop in error recovery. */
      yyla.kind_ = symbol_kind::S_YYUNDEF;
      goto yyerrlab1;
    }

    /* If the proper action on seeing token YYLA.TYPE is to reduce or
       to detect an error, take that action.  */
    yyn += yyla.kind ();
    if (yyn < 0 || yylast_ < yyn || yycheck_[yyn] != yyla.kind ())
      {
        goto yydefault;
      }

    // Reduce or error.
    yyn = yytable_[yyn];
    if (yyn <= 0)
      {
        if (yy_table_value_is_error_ (yyn))
          goto yyerrlab;
        yyn = -yyn;
        goto yyreduce;
      }

    // Count tokens shifted since error; after three, turn off error status.
    if (yyerrstatus_)
      --yyerrstatus_;

    // Shift the lookahead token.
    yypush_ ("Shifting", state_type (yyn), YY_MOVE (yyla));
    goto yynewstate;


  /*-----------------------------------------------------------.
  | yydefault -- do the default action for the current state.  |
  `-----------------------------------------------------------*/
  yydefault:
    yyn = yydefact_[+yystack_[0].state];
    if (yyn == 0)
      goto yyerrlab;
    goto yyreduce;


  /*-----------------------------.
  | yyreduce -- do a reduction.  |
  `-----------------------------*/
  yyreduce:
    yylen = yyr2_[yyn];
    {
      stack_symbol_type yylhs;
      yylhs.state = yy_lr_goto_state_ (yystack_[yylen].state, yyr1_[yyn]);
      /* Variants are always initialized to an empty instance of the
         correct type. The default '$$ = $1' action is NOT applied
         when using variants.  */
      switch (yyr1_[yyn])
    {
      case symbol_kind::S_sync_strength: // sync_strength
        yylhs.value.emplace< enum tchecker::sync_strength_t > ();
        break;

      case symbol_kind::S_attr: // attr
        yylhs.value.emplace< std::shared_ptr<tchecker::parsing::attr_t> > ();
        break;

      case symbol_kind::S_sync_constraint: // sync_constraint
        yylhs.value.emplace< std::shared_ptr<tchecker::parsing::sync_constraint_t> > ();
        break;

      case symbol_kind::S_TOK_ID: // "identifier"
      case symbol_kind::S_TOK_INTEGER: // "integer value"
      case symbol_kind::S_TOK_TEXT: // "text value"
      case symbol_kind::S_text_or_empty: // text_or_empty
        yylhs.value.emplace< std::string > ();
        break;

      case symbol_kind::S_sync_constraint_list: // sync_constraint_list
        yylhs.value.emplace< std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > ();
        break;

      case symbol_kind::S_integer: // integer
        yylhs.value.emplace< tchecker::integer_t > ();
        break;

      case symbol_kind::S_attr_list: // attr_list
      case symbol_kind::S_non_empty_attr_list: // non_empty_attr_list
        yylhs.value.emplace< tchecker::parsing::attributes_t > ();
        break;

      case symbol_kind::S_uinteger: // uinteger
        yylhs.value.emplace< unsigned int > ();
        break;

      default:
        break;
    }


      // Default location.
      {
        stack_type::slice range (yystack_, yylen);
        YYLLOC_DEFAULT (yylhs.location, range, yylen);
        yyerror_range[1].location = yylhs.location;
      }

      // Perform the reduction.
      YY_REDUCE_PRINT (yyn);
#if YY_EXCEPTIONS
      try
#endif // YY_EXCEPTIONS
        {
          switch (yyn)
            {
  case 2: // $@1: %empty
#line 111 "system.yy"
                                                             {
  std::stringstream loc;
  loc << yylhs.location;
  system_declaration = std::make_shared<tchecker::parsing::system_declaration_t>(yystack_[2].value.as < std::string > (), yystack_[1].value.as < tchecker::parsing::attributes_t > (), loc.str());
}
#line 824 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 3: // system: eol_sequence "system" ":" "identifier" attr_list end_declaration $@1 declaration_list
#line 117 "system.yy"
{
  if (tchecker::log_error_count() > old_error_count)
    system_declaration = nullptr;
}
#line 833 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 4: // system: error "end of file"
#line 122 "system.yy"
{
  system_declaration = nullptr;
}
#line 841 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 5: // declaration_list: non_empty_declaration_list eol_sequence
#line 130 "system.yy"
{}
#line 847 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 6: // declaration_list: eol_sequence
#line 132 "system.yy"
{}
#line 853 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 7: // non_empty_declaration_list: eol_sequence declaration
#line 138 "system.yy"
{}
#line 859 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 8: // non_empty_declaration_list: non_empty_declaration_list eol_sequence declaration
#line 140 "system.yy"
{}
#line 865 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 9: // declaration: "clock" ":" uinteger ":" "identifier" attr_list end_declaration
#line 146 "system.yy"
{
  auto exist_d = system_declaration->get_clock_declaration(yystack_[2].value.as < std::string > ());
  if (exist_d != nullptr)
    std::cerr << tchecker::log_error << yystack_[2].location << " multiple declarations of clock " << yystack_[2].value.as < std::string > () << std::endl;
  else {
    auto intd = system_declaration->get_int_declaration(yystack_[2].value.as < std::string > ());
    if (intd != nullptr)
      std::cerr << tchecker::log_error << yystack_[2].location << " variable " << yystack_[2].value.as < std::string > () << " already declared as an int" << std::endl;
    else {
      try {
        std::stringstream loc;
        loc << yylhs.location;
        auto d = std::make_shared<tchecker::parsing::clock_declaration_t>(yystack_[2].value.as < std::string > (), yystack_[4].value.as < unsigned int > (), yystack_[1].value.as < tchecker::parsing::attributes_t > (), loc.str());
        if ( ! system_declaration->insert_clock_declaration(d) )
          std::cerr << tchecker::log_error << yylhs.location << " insertion of clock declaration failed" << std::endl;
      }
      catch (std::exception const & e) {
        std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
      }
    }
  }
}
#line 892 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 10: // declaration: "edge" ":" "identifier" ":" "identifier" ":" "identifier" ":" "identifier" attr_list end_declaration
#line 170 "system.yy"
{
  auto proc = system_declaration->get_process_declaration(yystack_[8].value.as < std::string > ());
  if (proc == nullptr)
    std::cerr << tchecker::log_error << yystack_[8].location << " process " << yystack_[8].value.as < std::string > () << " is not declared" << std::endl;
  else {
    auto src = system_declaration->get_location_declaration(yystack_[8].value.as < std::string > (), yystack_[6].value.as < std::string > ());
    if (src == nullptr)
      std::cerr << tchecker::log_error << yystack_[6].location << " location " << yystack_[6].value.as < std::string > () << " is not declared in process " << yystack_[8].value.as < std::string > () << std::endl;
    else {
      auto tgt = system_declaration->get_location_declaration(yystack_[8].value.as < std::string > (), yystack_[4].value.as < std::string > ());
      if (tgt == nullptr)
        std::cerr << tchecker::log_error << yystack_[4].location << " location " << yystack_[4].value.as < std::string > () << " is not declared in process " << yystack_[8].value.as < std::string > () << std::endl;
      else {
        auto event = system_declaration->get_event_declaration(yystack_[2].value.as < std::string > ());
        if (event == nullptr)
          std::cerr << tchecker::log_error << yystack_[2].location << " event " << yystack_[2].value.as < std::string > () << " is not declared" << std::endl;
        else {
          try {
            std::stringstream loc;
            loc << yylhs.location;
            auto d = std::make_shared<tchecker::parsing::edge_declaration_t>(proc, src, tgt, event, yystack_[1].value.as < tchecker::parsing::attributes_t > (), loc.str());
            if ( ! system_declaration->insert_edge_declaration(d) ) {
              std::cerr << tchecker::log_error << yylhs.location << " insertion of edge declaration failed" << std::endl;
              d = nullptr;
            }
          }
          catch (std::exception const & e) {
            std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
          }
        }
      }
    }
  }
}
#line 931 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 11: // declaration: "event" ":" "identifier" attr_list end_declaration
#line 206 "system.yy"
{
  auto exist_d = system_declaration->get_event_declaration(yystack_[2].value.as < std::string > ());
  if (exist_d != nullptr)
    std::cerr << tchecker::log_error << yystack_[2].location << " multiple declarations of event " << yystack_[2].value.as < std::string > () << std::endl;
  else {
    try {
      std::stringstream loc;
      loc << yylhs.location;
      auto d = std::make_shared<tchecker::parsing::event_declaration_t>(yystack_[2].value.as < std::string > (), yystack_[1].value.as < tchecker::parsing::attributes_t > (), loc.str());
      if ( ! system_declaration->insert_event_declaration(d) ) {
        std::cerr << tchecker::log_error << yylhs.location << " insertion of event declaration failed" << std::endl;
        d = nullptr;
      }
    }
    catch (std::exception const & e) {
      std::cerr << yylhs.location << " " << e.what() << std::endl;
    }
  }
}
#line 955 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 12: // declaration: "int" ":" uinteger ":" integer ":" integer ":" integer ":" "identifier" attr_list end_declaration
#line 227 "system.yy"
{
  auto exist_d = system_declaration->get_int_declaration(yystack_[2].value.as < std::string > ());
  if (exist_d != nullptr)
    std::cerr << tchecker::log_error << yystack_[2].location << " multiple declarations of int variable " << yystack_[2].value.as < std::string > () << std::endl;
  else {
    auto clockd = system_declaration->get_clock_declaration(yystack_[2].value.as < std::string > ());
    if (clockd != nullptr)
      std::cerr << tchecker::log_error << yystack_[2].location << " variable " << yystack_[2].value.as < std::string > () << " already declared as a clock" << std::endl;
    else {
      try {
        std::stringstream loc;
        loc << yylhs.location;
        auto d = std::make_shared<tchecker::parsing::int_declaration_t>(yystack_[2].value.as < std::string > (), yystack_[10].value.as < unsigned int > (), yystack_[8].value.as < tchecker::integer_t > (), yystack_[6].value.as < tchecker::integer_t > (), yystack_[4].value.as < tchecker::integer_t > (), yystack_[1].value.as < tchecker::parsing::attributes_t > (), loc.str());
        if ( ! system_declaration->insert_int_declaration(d) ) {
          std::cerr << tchecker::log_error << yylhs.location << " insertion of int declaration failed" << std::endl;
          d = nullptr;
        }
      }
      catch (std::exception const & e) {
        std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
      }
    }
  }
}
#line 984 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 13: // declaration: "location" ":" "identifier" ":" "identifier" attr_list end_declaration
#line 253 "system.yy"
{
  auto exist_d = system_declaration->get_location_declaration(yystack_[4].value.as < std::string > (), yystack_[2].value.as < std::string > ());
  if (exist_d != nullptr)
    std::cerr << tchecker::log_error << yystack_[2].location << " multiple declarations of location " << yystack_[2].value.as < std::string > () << " in process " << yystack_[4].value.as < std::string > () << std::endl;
  else {
    auto proc = system_declaration->get_process_declaration(yystack_[4].value.as < std::string > ());
    if (proc == nullptr)
      std::cerr << tchecker::log_error << yystack_[4].location << " process " << yystack_[4].value.as < std::string > () << " is not declared" << std::endl;
    else {
      try {
        std::stringstream loc;
        loc << yylhs.location;
        auto d = std::make_shared<location_declaration_t>(yystack_[2].value.as < std::string > (), proc, yystack_[1].value.as < tchecker::parsing::attributes_t > (), loc.str());
        if ( ! system_declaration->insert_location_declaration(d) ) {
          std::cerr << tchecker::log_error << yylhs.location << " insertion of location declaration failed" << std::endl;
          d = nullptr;
        }
      }
      catch (std::exception const & e) {
        std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
      }
    }
  }
}
#line 1013 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 14: // declaration: "process" ":" "identifier" attr_list end_declaration
#line 279 "system.yy"
{
  auto exist_d = system_declaration->get_process_declaration(yystack_[2].value.as < std::string > ());
  if (exist_d != nullptr)
    std::cerr << tchecker::log_error << yystack_[2].location << " multiple declarations of process " << yystack_[2].value.as < std::string > () << std::endl;
  else {
    try {
      std::stringstream loc;
      loc << yylhs.location;
      auto d = std::make_shared<tchecker::parsing::process_declaration_t>(yystack_[2].value.as < std::string > (), yystack_[1].value.as < tchecker::parsing::attributes_t > (), loc.str());
      if ( ! system_declaration->insert_process_declaration(d) ) {
        std::cerr << tchecker::log_error << yystack_[0].location << " insertion of process declaration failed" << std::endl;
        d = nullptr;
      }
    }
    catch (std::exception const & e) {
      std::cerr << tchecker::log_error << yystack_[0].location << " " << e.what() << std::endl;
    }
  }
}
#line 1037 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 15: // declaration: "sync" ":" sync_constraint_list attr_list end_declaration
#line 300 "system.yy"
{
  try {
    std::stringstream loc;
    loc << yylhs.location;
    auto d = std::make_shared<tchecker::parsing::sync_declaration_t>(yystack_[2].value.as < std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > (), yystack_[1].value.as < tchecker::parsing::attributes_t > (), loc.str());
    if ( ! system_declaration->insert_sync_declaration(d) ) {
      std::cerr << tchecker::log_error << yylhs.location << " insertion of sync declaration failed" << std::endl;
      d = nullptr;
    }
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yylhs.location << " " << e.what() << std::endl;
  }
}
#line 1056 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 17: // attr_list: "{" non_empty_attr_list "}"
#line 321 "system.yy"
{ yylhs.value.as < tchecker::parsing::attributes_t > () = std::move(yystack_[1].value.as < tchecker::parsing::attributes_t > ()); }
#line 1062 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 18: // attr_list: "{" "}"
#line 323 "system.yy"
{ yylhs.value.as < tchecker::parsing::attributes_t > ().clear(); }
#line 1068 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 19: // attr_list: %empty
#line 325 "system.yy"
{ yylhs.value.as < tchecker::parsing::attributes_t > ().clear(); }
#line 1074 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 20: // non_empty_attr_list: attr
#line 331 "system.yy"
{
  yylhs.value.as < tchecker::parsing::attributes_t > ().insert(yystack_[0].value.as < std::shared_ptr<tchecker::parsing::attr_t> > ());
}
#line 1082 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 21: // non_empty_attr_list: non_empty_attr_list ":" attr
#line 335 "system.yy"
{
  yystack_[2].value.as < tchecker::parsing::attributes_t > ().insert(yystack_[0].value.as < std::shared_ptr<tchecker::parsing::attr_t> > ());
  yylhs.value.as < tchecker::parsing::attributes_t > () = std::move(yystack_[2].value.as < tchecker::parsing::attributes_t > ());
}
#line 1091 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 22: // attr: "identifier" ":" text_or_empty
#line 344 "system.yy"
{
  if (yystack_[2].value.as < std::string > () == "")
    throw std::runtime_error("empty tokens should not be accepted by the parser");
  std::stringstream key_loc, value_loc;
  key_loc << yystack_[2].location;
  value_loc << yystack_[0].location;
  boost::trim(yystack_[0].value.as < std::string > ());
  yylhs.value.as < std::shared_ptr<tchecker::parsing::attr_t> > () = std::make_shared<tchecker::parsing::attr_t>(yystack_[2].value.as < std::string > (), yystack_[0].value.as < std::string > (), tchecker::parsing::attr_parsing_position_t{key_loc.str(), value_loc.str()});
}
#line 1105 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 23: // text_or_empty: "text value"
#line 358 "system.yy"
{ yylhs.value.as < std::string > () = std::move(yystack_[0].value.as < std::string > ()); }
#line 1111 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 24: // text_or_empty: %empty
#line 360 "system.yy"
{ yylhs.value.as < std::string > ().clear(); }
#line 1117 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 25: // sync_constraint_list: sync_constraint
#line 366 "system.yy"
{
  if (yystack_[0].value.as < std::shared_ptr<tchecker::parsing::sync_constraint_t> > () != nullptr)
    yylhs.value.as < std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > ().push_back(yystack_[0].value.as < std::shared_ptr<tchecker::parsing::sync_constraint_t> > ());
}
#line 1126 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 26: // sync_constraint_list: sync_constraint_list ":" sync_constraint
#line 371 "system.yy"
{
  if (yystack_[0].value.as < std::shared_ptr<tchecker::parsing::sync_constraint_t> > () != nullptr)
    yystack_[2].value.as < std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > ().push_back(yystack_[0].value.as < std::shared_ptr<tchecker::parsing::sync_constraint_t> > ());
  yylhs.value.as < std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > () = std::move(yystack_[2].value.as < std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > ());
}
#line 1136 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 27: // sync_constraint: "identifier" "@" "identifier" sync_strength
#line 381 "system.yy"
{
  auto proc = system_declaration->get_process_declaration(yystack_[3].value.as < std::string > ());
  if (proc == nullptr)
    std::cerr << tchecker::log_error << yystack_[3].location << " process " << yystack_[3].value.as < std::string > () << " is not declared" << std::endl;
  else {
    auto event = system_declaration->get_event_declaration(yystack_[1].value.as < std::string > ());
    if (event == nullptr)
      std::cerr << tchecker::log_error << yystack_[1].location << " event " << yystack_[1].value.as < std::string > () << " is not declared" << std::endl;
    else
      yylhs.value.as < std::shared_ptr<tchecker::parsing::sync_constraint_t> > () = std::make_shared<tchecker::parsing::sync_constraint_t>(proc, event, yystack_[0].value.as < enum tchecker::sync_strength_t > ());
  }
}
#line 1153 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 28: // sync_strength: "?"
#line 398 "system.yy"
{ yylhs.value.as < enum tchecker::sync_strength_t > () = tchecker::SYNC_WEAK; }
#line 1159 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 29: // sync_strength: %empty
#line 400 "system.yy"
{ yylhs.value.as < enum tchecker::sync_strength_t > () = tchecker::SYNC_STRONG; }
#line 1165 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 34: // integer: "integer value"
#line 418 "system.yy"
{
  try {
    long long l = std::stoll(yystack_[0].value.as < std::string > (), nullptr, 10);
    if ( (l < std::numeric_limits<tchecker::integer_t>::min()) || (l > std::numeric_limits<tchecker::integer_t>::max()) )
      throw std::out_of_range("integer constant our of range");
    yylhs.value.as < tchecker::integer_t > () = static_cast<tchecker::integer_t>(l);
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yystack_[0].location << " value " << yystack_[0].value.as < std::string > () << " out of range ";
    std::cerr << std::numeric_limits<tchecker::integer_t>::min() << "," << std::numeric_limits<tchecker::integer_t>::max();
    std::cerr << std::endl;
    yylhs.value.as < tchecker::integer_t > () = 0;
  }
}
#line 1184 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;

  case 35: // uinteger: "integer value"
#line 437 "system.yy"
{
  try {
    unsigned long l = std::stoul(yystack_[0].value.as < std::string > (), nullptr, 10);
    if (l > std::numeric_limits<unsigned int>::max())
      throw std::out_of_range("unsigned integer out of range");
    yylhs.value.as < unsigned int > () = static_cast<unsigned int>(l);
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << yystack_[0].location << " value " << yystack_[0].value.as < std::string > () << " out of range ";
    std::cerr << std::numeric_limits<unsigned int>::min() << "," << std::numeric_limits<unsigned int>::max();
    std::cerr << std::endl;
    yylhs.value.as < unsigned int > () = 0;
  }
}
#line 1203 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"
    break;


#line 1207 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.cc"

            default:
              break;
            }
        }
#if YY_EXCEPTIONS
      catch (const syntax_error& yyexc)
        {
          YYCDEBUG << "Caught exception: " << yyexc.what() << '\n';
          error (yyexc);
          YYERROR;
        }
#endif // YY_EXCEPTIONS
      YY_SYMBOL_PRINT ("-> $$ =", yylhs);
      yypop_ (yylen);
      yylen = 0;

      // Shift the result of the reduction.
      yypush_ (YY_NULLPTR, YY_MOVE (yylhs));
    }
    goto yynewstate;


  /*--------------------------------------.
  | yyerrlab -- here on detecting error.  |
  `--------------------------------------*/
  yyerrlab:
    // If not already recovering from an error, report this error.
    if (!yyerrstatus_)
      {
        ++yynerrs_;
        context yyctx (*this, yyla);
        std::string msg = yysyntax_error_ (yyctx);
        error (yyla.location, YY_MOVE (msg));
      }


    yyerror_range[1].location = yyla.location;
    if (yyerrstatus_ == 3)
      {
        /* If just tried and failed to reuse lookahead token after an
           error, discard it.  */

        // Return failure if at end of input.
        if (yyla.kind () == symbol_kind::S_YYEOF)
          YYABORT;
        else if (!yyla.empty ())
          {
            yy_destroy_ ("Error: discarding", yyla);
            yyla.clear ();
          }
      }

    // Else will try to reuse lookahead token after shifting the error token.
    goto yyerrlab1;


  /*---------------------------------------------------.
  | yyerrorlab -- error raised explicitly by YYERROR.  |
  `---------------------------------------------------*/
  yyerrorlab:
    /* Pacify compilers when the user code never invokes YYERROR and
       the label yyerrorlab therefore never appears in user code.  */
    if (false)
      YYERROR;

    /* Do not reclaim the symbols of the rule whose action triggered
       this YYERROR.  */
    yypop_ (yylen);
    yylen = 0;
    YY_STACK_PRINT ();
    goto yyerrlab1;


  /*-------------------------------------------------------------.
  | yyerrlab1 -- common code for both syntax error and YYERROR.  |
  `-------------------------------------------------------------*/
  yyerrlab1:
    yyerrstatus_ = 3;   // Each real token shifted decrements this.
    // Pop stack until we find a state that shifts the error token.
    for (;;)
      {
        yyn = yypact_[+yystack_[0].state];
        if (!yy_pact_value_is_default_ (yyn))
          {
            yyn += symbol_kind::S_YYerror;
            if (0 <= yyn && yyn <= yylast_
                && yycheck_[yyn] == symbol_kind::S_YYerror)
              {
                yyn = yytable_[yyn];
                if (0 < yyn)
                  break;
              }
          }

        // Pop the current state because it cannot handle the error token.
        if (yystack_.size () == 1)
          YYABORT;

        yyerror_range[1].location = yystack_[0].location;
        yy_destroy_ ("Error: popping", yystack_[0]);
        yypop_ ();
        YY_STACK_PRINT ();
      }
    {
      stack_symbol_type error_token;

      yyerror_range[2].location = yyla.location;
      YYLLOC_DEFAULT (error_token.location, yyerror_range, 2);

      // Shift the error token.
      error_token.state = state_type (yyn);
      yypush_ ("Shifting", YY_MOVE (error_token));
    }
    goto yynewstate;


  /*-------------------------------------.
  | yyacceptlab -- YYACCEPT comes here.  |
  `-------------------------------------*/
  yyacceptlab:
    yyresult = 0;
    goto yyreturn;


  /*-----------------------------------.
  | yyabortlab -- YYABORT comes here.  |
  `-----------------------------------*/
  yyabortlab:
    yyresult = 1;
    goto yyreturn;


  /*-----------------------------------------------------.
  | yyreturn -- parsing is finished, return the result.  |
  `-----------------------------------------------------*/
  yyreturn:
    if (!yyla.empty ())
      yy_destroy_ ("Cleanup: discarding lookahead", yyla);

    /* Do not reclaim the symbols of the rule whose action triggered
       this YYABORT or YYACCEPT.  */
    yypop_ (yylen);
    YY_STACK_PRINT ();
    while (1 < yystack_.size ())
      {
        yy_destroy_ ("Cleanup: popping", yystack_[0]);
        yypop_ ();
      }

    return yyresult;
  }
#if YY_EXCEPTIONS
    catch (...)
      {
        YYCDEBUG << "Exception caught: cleaning lookahead and stack\n";
        // Do not try to display the values of the reclaimed symbols,
        // as their printers might throw an exception.
        if (!yyla.empty ())
          yy_destroy_ (YY_NULLPTR, yyla);

        while (1 < yystack_.size ())
          {
            yy_destroy_ (YY_NULLPTR, yystack_[0]);
            yypop_ ();
          }
        throw;
      }
#endif // YY_EXCEPTIONS
  }